

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_crc32.c
# Opt level: O0

int csp_crc32_verify(csp_packet_t *packet)

{
  uint32_t uVar1;
  __uint32_t _Var2;
  void *in_RDI;
  uint32_t crc;
  uint32_t in_stack_ffffffffffffffec;
  int local_4;
  
  if (*(ushort *)((long)in_RDI + 0x2a) < 4) {
    local_4 = -0x66;
  }
  else {
    csp_id_prepend((csp_packet_t *)0x1082ff);
    uVar1 = csp_crc32_memory(in_RDI,in_stack_ffffffffffffffec);
    _Var2 = __bswap_32(uVar1);
    if (*(__uint32_t *)((long)in_RDI + (ulong)*(ushort *)((long)in_RDI + 0x2a) + 0x44) != _Var2) {
      uVar1 = csp_crc32_memory(in_RDI,_Var2);
      _Var2 = __bswap_32(uVar1);
      if (*(__uint32_t *)((long)in_RDI + (ulong)*(ushort *)((long)in_RDI + 0x2a) + 0x44) != _Var2) {
        return -0x66;
      }
    }
    *(short *)((long)in_RDI + 0x2a) = *(short *)((long)in_RDI + 0x2a) + -4;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int csp_crc32_verify(csp_packet_t * packet) {

	uint32_t crc;

	if (packet->length < sizeof(crc)) {
		return CSP_ERR_CRC32;
	}

	/* Calculate CRC32, convert to network byte order */
	csp_id_prepend(packet);
	crc = csp_crc32_memory(packet->frame_begin, packet->frame_length - sizeof(crc));
	crc = htobe32(crc);

	/* Compare calculated checksum with packet header */
	if (memcmp(&packet->data[packet->length] - sizeof(crc), &crc, sizeof(crc)) != 0) {

		/* CRC32 with header failed, try without header */
		crc = csp_crc32_memory(packet->data, packet->length - sizeof(crc));
		crc = htobe32(crc);

		if (memcmp(&packet->data[packet->length] - sizeof(crc), &crc, sizeof(crc)) != 0) {
			return CSP_ERR_CRC32;
		}
		
	}

	/* Strip CRC32 */
	packet->length -= sizeof(crc);
	return CSP_ERR_NONE;
}